

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atcp.c
# Opt level: O0

void nn_atcp_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  nn_fsm *local_30;
  nn_atcp *atcp;
  void *srcptr_local;
  int type_local;
  int src_local;
  nn_fsm *self_local;
  
  local_30 = self;
  if (self == (nn_fsm *)0x0) {
    local_30 = (nn_fsm *)0x0;
  }
  if (src == -2 && type == -3) {
    iVar1 = nn_stcp_isidle((nn_stcp *)&local_30[8].stopped);
    if (iVar1 == 0) {
      nn_epbase_stat_increment((nn_epbase *)local_30[1].shutdown_fn,0x67,1);
      nn_stcp_stop((nn_stcp *)&local_30[8].stopped);
    }
    *(undefined4 *)&local_30[1].fn = 7;
  }
  if (*(int *)&local_30[1].fn == 7) {
    iVar1 = nn_stcp_isidle((nn_stcp *)&local_30[8].stopped);
    if (iVar1 == 0) {
      return;
    }
    nn_usock_stop((nn_usock *)&local_30[1].state);
    *(undefined4 *)&local_30[1].fn = 8;
  }
  if (*(int *)&local_30[1].fn == 8) {
    iVar1 = nn_usock_isidle((nn_usock *)&local_30[1].state);
    if (iVar1 != 0) {
      if (local_30[8].srcptr != (void *)0x0) {
        if (local_30[8].ctx == (nn_ctx *)0x0) {
          fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","atcp->listener_owner.fsm",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
                  ,0x7e);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_usock_swap_owner((nn_usock *)local_30[8].srcptr,(nn_fsm_owner *)&local_30[8].owner);
        local_30[8].srcptr = (void *)0x0;
        *(undefined4 *)&local_30[8].owner = 0xffffffff;
        local_30[8].ctx = (nn_ctx *)0x0;
      }
      *(undefined4 *)&local_30[1].fn = 1;
      nn_fsm_stopped(local_30,0x85b9);
    }
    return;
  }
  fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
          (ulong)*(uint *)&local_30[1].fn,(ulong)(uint)src,(ulong)(uint)type,
          "/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/src/transports/tcp/atcp.c"
          ,0x89);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_atcp_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_atcp *atcp;

    atcp = nn_cont (self, struct nn_atcp, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_stcp_isidle (&atcp->stcp)) {
            nn_epbase_stat_increment (atcp->epbase,
                NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_stcp_stop (&atcp->stcp);
        }
        atcp->state = NN_ATCP_STATE_STOPPING_STCP_FINAL;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING_STCP_FINAL)) {
        if (!nn_stcp_isidle (&atcp->stcp))
            return;
        nn_usock_stop (&atcp->usock);
        atcp->state = NN_ATCP_STATE_STOPPING;
    }
    if (nn_slow (atcp->state == NN_ATCP_STATE_STOPPING)) {
        if (!nn_usock_isidle (&atcp->usock))
            return;
       if (atcp->listener) {
            nn_assert (atcp->listener_owner.fsm);
            nn_usock_swap_owner (atcp->listener, &atcp->listener_owner);
            atcp->listener = NULL;
            atcp->listener_owner.src = -1;
            atcp->listener_owner.fsm = NULL;
        }
        atcp->state = NN_ATCP_STATE_IDLE;
        nn_fsm_stopped (&atcp->fsm, NN_ATCP_STOPPED);
        return;
    }

    nn_fsm_bad_action(atcp->state, src, type);
}